

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O3

int x509_openssl_add_engine_key(SSL_CTX *ssl_ctx,char *x509privatekey_id,ENGINE *engine)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *pkey;
  LOGGER_LOG p_Var3;
  char *message;
  
  iVar1 = ENGINE_init((ENGINE *)engine);
  if (iVar1 == 0) {
    iVar1 = 0xe9;
    message = "unable to initialize ENGINE.";
  }
  else {
    iVar1 = ENGINE_set_default((ENGINE *)engine,0xffff);
    if (iVar1 == 0) {
      log_ERR_get_error("unable to configure ENGINE.");
      iVar1 = 0xf0;
    }
    else {
      iVar1 = 0;
      pkey = ENGINE_load_private_key
                       ((ENGINE *)engine,x509privatekey_id,(UI_METHOD *)0x0,(void *)0x0);
      if (pkey == (EVP_PKEY *)0x0) {
        log_ERR_get_error("unable to load private key from ENGINE.");
        iVar1 = 0xf9;
      }
      else {
        iVar2 = load_ecc_key(ssl_ctx,(EVP_PKEY *)pkey);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          iVar1 = 0x100;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/x509_openssl.c"
                      ,"x509_openssl_add_engine_key",0xff,1,
                      "unable to configure private key from ENGINE.");
          }
        }
        EVP_PKEY_free(pkey);
      }
    }
    iVar2 = ENGINE_finish((ENGINE *)engine);
    if (iVar2 != 0) {
      return iVar1;
    }
    iVar1 = 0x10e;
    message = "unable to release ENGINE functional reference.";
  }
  log_ERR_get_error(message);
  return iVar1;
}

Assistant:

int x509_openssl_add_engine_key(SSL_CTX* ssl_ctx, const char* x509privatekey_id, ENGINE* engine)
{
    int result;

    // Engine functional reference is short-lived, only within this function.
    if (!ENGINE_init(engine))
    {
        log_ERR_get_error("unable to initialize ENGINE.");
        result = MU_FAILURE;
    }
    else
    {
        if (!ENGINE_set_default(engine, ENGINE_METHOD_ALL))
        {
            log_ERR_get_error("unable to configure ENGINE.");
            result = MU_FAILURE;
        }
        else
        {
            EVP_PKEY* evp_key = ENGINE_load_private_key(engine, x509privatekey_id, NULL, NULL);

            if (evp_key == NULL)
            {
                log_ERR_get_error("unable to load private key from ENGINE.");
                result = MU_FAILURE;
            }
            else
            {
                if (load_ecc_key(ssl_ctx, evp_key) != 0)
                {
                    LogError("unable to configure private key from ENGINE.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                EVP_PKEY_free(evp_key);
            }
        }

        if (!ENGINE_finish(engine))  // Release functional reference.
        {
            log_ERR_get_error("unable to release ENGINE functional reference.");
            result = MU_FAILURE;
        }
    }

    return result;
}